

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_File_read_ordered_end(MPIABI_File fh,void *buf,MPIABI_Status *status)

{
  int iVar1;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_File_read_ordered_end();
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_File_read_ordered_end(
  MPIABI_File fh,
  void * buf,
  MPIABI_Status * status
) {
  return MPI_File_read_ordered_end(
    (MPI_File)(WPI_File)fh,
    buf,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}